

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1147904::Target::DumpSourceGroup
          (Value *__return_storage_ptr__,Target *this,SourceGroup *sg)

{
  Value *pVVar1;
  Value *this_00;
  Value local_50;
  undefined1 local_21;
  SourceGroup *local_20;
  SourceGroup *sg_local;
  Target *this_local;
  Value *group;
  
  local_21 = 0;
  local_20 = sg;
  sg_local = (SourceGroup *)this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_50,&local_20->Name);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar1,&local_50);
  Json::Value::~Value(&local_50);
  pVVar1 = &local_20->SourceIndexes;
  this_00 = Json::Value::operator[](__return_storage_ptr__,"sourceIndexes");
  Json::Value::operator=(this_00,pVVar1);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpSourceGroup(SourceGroup& sg)
{
  Json::Value group = Json::objectValue;
  group["name"] = sg.Name;
  group["sourceIndexes"] = std::move(sg.SourceIndexes);
  return group;
}